

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::sort_columns(persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               *this)

{
  ostream *poVar1;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_68;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_48;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar1 = std::operator<<(poVar1,"sorting ");
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::size
            (&this->columns_to_reduce);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," columns");
  poVar1 = (ostream *)std::ostream::flush();
  std::operator<<(poVar1,"\r");
  local_48._M_cur =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_48._M_first =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_48._M_last =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_48._M_node =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_68._M_cur =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_68._M_first =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_68._M_last =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_68._M_node =
       (this->columns_to_reduce).
       super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::
  sort<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>,greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t&>>
            (&local_48,&local_68,this->complex);
  std::operator<<((ostream *)&std::cout,"\x1b[K");
  return;
}

Assistant:

void sort_columns() {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "sorting " << columns_to_reduce.size() << " columns" << std::flush << "\r";
#endif

#ifdef SORT_COLUMNS_BY_PIVOT
		std_algorithms::sort(
		    columns_to_reduce.begin(), columns_to_reduce.end(),
		    greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t, decltype(complex)>(complex));
#else
		std_algorithms::sort(columns_to_reduce.begin(), columns_to_reduce.end(),
		                     greater_filtration_or_smaller_index<filtration_index_t>());
#endif
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}